

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

Federate * __thiscall helics::Federate::operator=(Federate *this,Federate *fed)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer __p;
  pointer __p_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  LOCK();
  (this->currentMode)._M_i = (fed->currentMode)._M_i;
  UNLOCK();
  LOCK();
  (fed->currentMode)._M_i = FINALIZE;
  UNLOCK();
  (this->fedID).fid = (fed->fedID).fid;
  peVar2 = (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  CoreFactory::getEmptyCore();
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->mCurrentTime).internalTimeCode = (fed->mCurrentTime).internalTimeCode;
  this->nameSegmentSeparator = fed->nameSegmentSeparator;
  this->strictConfigChecking = fed->strictConfigChecking;
  __p = (fed->asyncCallInfo)._M_t.
        super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
        .
        super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
        ._M_head_impl;
  (fed->asyncCallInfo)._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  ._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
  std::
  __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::reset((__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
           *)&this->asyncCallInfo,__p);
  this->observerMode = fed->observerMode;
  __p_00 = (fed->cManager)._M_t.
           super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
           .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  (fed->cManager)._M_t.
  super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
  .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl =
       (ConnectorFederateManager *)0x0;
  std::
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           *)&this->cManager,__p_00);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fed->mName);
  return this;
}

Assistant:

Federate& Federate::operator=(Federate&& fed) noexcept
{
    auto tstate = fed.currentMode.load();
    currentMode.store(tstate);
    fed.currentMode.store(Modes::FINALIZE);
    fedID = fed.fedID;
    coreObject = std::move(fed.coreObject);
    fed.coreObject = CoreFactory::getEmptyCore();
    mCurrentTime = fed.mCurrentTime;
    nameSegmentSeparator = fed.nameSegmentSeparator;
    strictConfigChecking = fed.strictConfigChecking;
    asyncCallInfo = std::move(fed.asyncCallInfo);
    observerMode = fed.observerMode;
    cManager = std::move(fed.cManager);
    mName = std::move(fed.mName);
    return *this;
}